

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O0

boolean resists_magm(monst *mon)

{
  permonst *ptr_00;
  boolean bVar1;
  obj *local_38;
  obj *local_30;
  obj *local_28;
  obj *o;
  permonst *ptr;
  monst *mon_local;
  
  ptr_00 = mon->data;
  bVar1 = dmgtype(ptr_00,1);
  if (((bVar1 != '\0') || (ptr_00 == mons + 0x89)) || (bVar1 = dmgtype(ptr_00,0xf2), bVar1 != '\0'))
  {
    return '\x01';
  }
  if (mon == &youmonst) {
    local_30 = uwep;
  }
  else {
    local_30 = mon->mw;
  }
  if (((local_30 != (obj *)0x0) && (local_30->oartifact != '\0')) &&
     (bVar1 = defends(1,local_30), bVar1 != '\0')) {
    return '\x01';
  }
  if (mon == &youmonst) {
    local_38 = invent;
  }
  else {
    local_38 = mon->minvent;
  }
  local_28 = local_38;
  while( true ) {
    if (local_28 == (obj *)0x0) {
      return '\0';
    }
    if (((local_28->owornmask != 0) && (objects[local_28->otyp].oc_oprop == ',')) ||
       ((local_28->oartifact != '\0' && (bVar1 = protects(1,local_28), bVar1 != '\0')))) break;
    local_28 = local_28->nobj;
  }
  return '\x01';
}

Assistant:

boolean resists_magm(struct monst *mon)
{
	const struct permonst *ptr = mon->data;
	struct obj *o;

	/* as of 3.2.0:  gray dragons, Angels, Oracle, Yeenoghu */
	if (dmgtype(ptr, AD_MAGM) || ptr == &mons[PM_BABY_GRAY_DRAGON] ||
		dmgtype(ptr, AD_RBRE))	/* Chromatic Dragon */
	    return TRUE;
	/* check for magic resistance granted by wielded weapon */
	o = (mon == &youmonst) ? uwep : MON_WEP(mon);
	if (o && o->oartifact && defends(AD_MAGM, o))
	    return TRUE;
	/* check for magic resistance granted by worn or carried items */
	o = (mon == &youmonst) ? invent : mon->minvent;
	for ( ; o; o = o->nobj)
	    if ((o->owornmask && objects[o->otyp].oc_oprop == ANTIMAGIC) ||
		    (o->oartifact && protects(AD_MAGM, o)))
		return TRUE;
	return FALSE;
}